

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cc
# Opt level: O2

void __thiscall ReportAsync::~ReportAsync(ReportAsync *this)

{
  ostream *poVar1;
  
  (this->super_Reporter).super_ThreadCapture<Reporter>._vptr_ThreadCapture =
       (_func_int **)&PTR__ReportAsync_00109cc0;
  std::mutex::lock(&this->queue_lock_);
  this->terminated_ = true;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_lock_);
  if ((this->reporter_thread_)._M_t.
      super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
      super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Waiting for reporter thread to finish...");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::thread::join();
    poVar1 = std::operator<<((ostream *)&std::cerr,"Reporter thread finished.");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  capture_thread::ThreadCapture<Reporter>::AutoThreadCrosser::~AutoThreadCrosser
            (&this->cross_and_capture_to_);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (&this->reporter_thread_);
  std::
  deque<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~deque(&(this->queue_).c);
  std::condition_variable::~condition_variable(&this->queue_wait_);
  return;
}

Assistant:

~ReportAsync() {
    {
      std::lock_guard<std::mutex> lock(queue_lock_);
      terminated_ = true;
      queue_wait_.notify_all();
    }
    if (reporter_thread_) {
      std::cerr << "Waiting for reporter thread to finish..." << std::endl;
      reporter_thread_->join();
      std::cerr << "Reporter thread finished." << std::endl;
    }
  }